

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O0

MPP_RET vcodec_service_set_info(void *ctx,MppDevInfoCfg *cfg)

{
  undefined8 *puVar1;
  MppDevVcodecService *p;
  MppDevInfoCfg *cfg_local;
  void *ctx_local;
  
  if (*(int *)((long)ctx + 0x208) == 0) {
    memset((void *)((long)ctx + 0x210),0,0x100);
  }
  if (*(int *)((long)ctx + 0x208) < 0x10) {
    puVar1 = (undefined8 *)((long)ctx + (long)*(int *)((long)ctx + 0x208) * 0x10 + 0x210);
    *puVar1 = *(undefined8 *)cfg;
    puVar1[1] = cfg->data;
    *(int *)((long)ctx + 0x208) = *(int *)((long)ctx + 0x208) + 1;
    if (cfg->type == 3) {
      *(RK_U64 *)((long)ctx + 8) = cfg->data;
    }
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,"vcodec_service","info count reach max\n",(char *)0x0);
    ctx_local._4_4_ = MPP_NOK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET vcodec_service_set_info(void *ctx, MppDevInfoCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;

    if (!p->info_count)
        memset(p->info, 0, sizeof(p->info));

    if (p->info_count >= MAX_INFO_COUNT) {
        mpp_err("info count reach max\n");
        return MPP_NOK;
    }

    memcpy(&p->info[p->info_count], cfg, sizeof(MppDevInfoCfg));
    p->info_count++;

    if (cfg->type == INFO_FORMAT_TYPE) {
        p->fmt = cfg->data;
    }
    return MPP_OK;
}